

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::AssignmentPatternExpressionSyntax::getChild
          (AssignmentPatternExpressionSyntax *this,size_t index)

{
  long in_RDX;
  ConstTokenOrSyntax *in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffc8;
  ConstTokenOrSyntax *pCVar1;
  
  if (in_RDX == 0) {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  else if (in_RDX == 1) {
    pCVar1 = in_RDI;
    not_null<slang::syntax::AssignmentPatternSyntax_*>::get
              ((not_null<slang::syntax::AssignmentPatternSyntax_*> *)
               ((long)&in_RSI[1].
                       super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                       super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                       .
                       super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
               + 8));
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
    in_RDI = pCVar1;
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax AssignmentPatternExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return type;
        case 1: return pattern.get();
        default: return nullptr;
    }
}